

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiMemoryLowering.cpp
# Opt level: O0

size_t __thiscall wasm::MultiMemoryLowering::getInitialOffset(MultiMemoryLowering *this,Index idx)

{
  Module *this_00;
  Global *pGVar1;
  Const *pCVar2;
  Name name;
  Global *g;
  Index idx_local;
  MultiMemoryLowering *this_local;
  
  if (idx == 0) {
    this_local = (MultiMemoryLowering *)0x0;
  }
  else {
    this_00 = this->wasm;
    name = getOffsetGlobal(this,idx);
    pGVar1 = Module::getGlobal(this_00,name);
    pCVar2 = Expression::cast<wasm::Const>(pGVar1->init);
    this_local = (MultiMemoryLowering *)wasm::Literal::getUnsigned(&pCVar2->value);
  }
  return (size_t)this_local;
}

Assistant:

size_t getInitialOffset(Index idx) {
    if (idx == 0) {
      return 0;
    }
    auto* g = wasm->getGlobal(getOffsetGlobal(idx));
    return g->init->cast<Const>()->value.getUnsigned();
  }